

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O3

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
updateMeasurementCovarianceMatrix_(ModelBaseEKFFlexEstimatorIMU *this)

{
  uint uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  Matrix *_this;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  assign_op<double,_double> local_d9;
  ulong local_d8;
  ulong local_d0;
  Matrix *local_c8;
  ulong local_c0;
  long local_b8;
  SrcEvaluatorType local_b0;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_a0;
  DstXprType local_80;
  DstEvaluatorType local_48;
  
  _this = &this->R_;
  lVar15 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
  iVar5 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])();
  if (lVar15 == CONCAT44(extraout_var,iVar5)) goto LAB_00151521;
  uVar14 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
  iVar5 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])(this);
  iVar6 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])(this);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)_this,
        CONCAT44(extraout_var_00,iVar5),CONCAT44(extraout_var_01,iVar6));
  local_c0 = uVar14;
  if (this->useFTSensors_ == true) {
    uVar11 = (this->functor_).nbContacts_;
    uVar1 = uVar11 * 6;
    uVar13 = (ulong)uVar1;
    if ((long)(uVar13 + 6) <= (long)uVar14) goto LAB_0015121f;
    uVar14 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
    if (((long)(uVar14 - uVar13) < 6) ||
       ((this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
        < 6)) goto LAB_00151842;
    pdVar8 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data + 6;
    if (((ulong)pdVar8 & 7) == 0) {
      uVar9 = (ulong)((uint)((ulong)pdVar8 >> 3) & 1);
      if (uVar13 <= uVar9) {
        uVar9 = uVar13;
      }
      local_b8 = uVar14 * 8;
      lVar15 = 6;
      local_d8 = uVar14;
      local_d0 = uVar13;
      local_c8 = _this;
      do {
        if (0 < (long)uVar9) {
          *pdVar8 = 0.0;
        }
        uVar12 = uVar13 - uVar9;
        uVar14 = uVar12 & 0xfffffffffffffffe;
        lVar16 = uVar9 + uVar14;
        if (0 < (long)uVar14) {
          lVar7 = uVar9 + 2;
          if ((long)(uVar9 + 2) < lVar16) {
            lVar7 = lVar16;
          }
          memset(pdVar8 + uVar9,0,(~uVar9 + lVar7 & 0xfffffffffffffffe) * 8 + 0x10);
        }
        uVar13 = local_d0;
        if (lVar16 < (long)local_d0) {
          memset(pdVar8 + uVar14 + uVar9,0,(ulong)(((uint)uVar12 & 1) << 3));
        }
        uVar9 = (ulong)((int)uVar9 + (int)local_d8 & 1);
        if ((long)uVar13 < (long)uVar9) {
          uVar9 = uVar13;
        }
        pdVar8 = (double *)((long)pdVar8 + local_b8);
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
      uVar11 = (this->functor_).nbContacts_;
      uVar13 = (ulong)(uVar11 * 6);
      _this = local_c8;
    }
    else {
      lVar15 = 6;
      local_d8 = (ulong)uVar11;
      do {
        if (uVar1 != 0) {
          memset(pdVar8,0,uVar13 * 8);
        }
        pdVar8 = pdVar8 + uVar14;
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
      uVar11 = (uint)local_d8;
    }
    lVar15 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
    if ((lVar15 < 6) ||
       ((long)((this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_cols - uVar13) < 6)) goto LAB_00151842;
    pdVar8 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data + lVar15 * 6;
    if (((ulong)pdVar8 & 7) == 0) {
      if ((int)uVar13 != 0) {
        uVar14 = (ulong)pdVar8 >> 3;
        do {
          uVar11 = (uint)uVar14 & 1;
          uVar9 = (ulong)uVar11;
          if ((uVar14 & 1) != 0) {
            *pdVar8 = 0.0;
          }
          uVar14 = (ulong)(6 - uVar11 & 0xfffffffe | uVar11);
          if (uVar14 <= uVar9 + 2) {
            uVar14 = uVar9 + 2;
          }
          memset(pdVar8 + uVar9,0,((~uVar9 + uVar14) * 8 & 0x7ffffffffffffff0) + 0x10);
          if (uVar9 != 0) {
            pdVar8[5] = 0.0;
          }
          uVar14 = uVar9 + lVar15;
          pdVar8 = pdVar8 + lVar15;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
        uVar11 = (this->functor_).nbContacts_;
      }
    }
    else if ((int)uVar13 != 0) {
      do {
        pdVar8[4] = 0.0;
        pdVar8[5] = 0.0;
        pdVar8[2] = 0.0;
        pdVar8[3] = 0.0;
        *pdVar8 = 0.0;
        pdVar8[1] = 0.0;
        pdVar8 = pdVar8 + lVar15;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    uVar14 = 6;
    if (uVar11 != 0) {
      lVar15 = 0x30;
      uVar13 = 0;
      do {
        local_80.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_outerStride =
             (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
        local_80.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_data = (PointerType)
                 ((long)(this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data +
                 local_80.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .m_outerStride * uVar14 * 8 + lVar15);
        local_80.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_rows.m_value = 6;
        local_80.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_cols.m_value = 6;
        local_80.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
             _this;
        local_80.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_startRow.m_value = uVar14;
        local_80.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_startCol.m_value = uVar14;
        if ((local_80.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             m_outerStride + -6 < (long)uVar14) ||
           ((this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols + -6 < (long)uVar14)) goto LAB_00151842;
        local_b0.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        .m_d.data = (this->forceVariance_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_data;
        local_b0.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        .m_d.m_outerStride =
             (this->forceVariance_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
             .m_storage.m_rows;
        if ((local_b0.
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d
             .m_outerStride != 6) ||
           ((this->forceVariance_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols != 6)) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>]"
                       );
        }
        local_a0.m_dst = &local_48;
        local_a0.m_src = &local_b0;
        local_a0.m_functor = &local_d9;
        local_a0.m_dstExpr = &local_80;
        local_48.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_data = local_80.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                  .m_data;
        local_48.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_outerStride.m_value =
             local_80.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             m_outerStride;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run(&local_a0);
        uVar14 = uVar14 + 6;
        uVar13 = uVar13 + 1;
        lVar15 = lVar15 + 0x30;
      } while (uVar13 < (this->functor_).nbContacts_);
    }
  }
  else {
LAB_0015121f:
    uVar14 = 6;
  }
  if (((long)local_c0 < (long)(uVar14 + 6) & this->withAbsolutePos_) == 1) {
    lVar15 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
    if (((long)uVar14 <= lVar15 + -6) &&
       ((long)uVar14 <=
        (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       )) {
      local_d0 = uVar14 * 8;
      pdVar8 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data + uVar14;
      local_d8 = uVar14;
      local_c8 = _this;
      if (((ulong)pdVar8 & 7) == 0) {
        uVar13 = (ulong)pdVar8 >> 3;
        do {
          uVar11 = (uint)uVar13 & 1;
          uVar9 = (ulong)uVar11;
          if ((uVar13 & 1) != 0) {
            *pdVar8 = 0.0;
          }
          uVar13 = (ulong)(6 - uVar11 & 0xfffffffe | uVar11);
          if (uVar13 <= uVar9 + 2) {
            uVar13 = uVar9 + 2;
          }
          memset(pdVar8 + uVar9,0,((~uVar9 + uVar13) * 8 & 0x7ffffffffffffff0) + 0x10);
          if (uVar9 != 0) {
            pdVar8[5] = 0.0;
          }
          uVar13 = uVar9 + lVar15;
          pdVar8 = pdVar8 + lVar15;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      else {
        do {
          pdVar8[4] = 0.0;
          pdVar8[5] = 0.0;
          pdVar8[2] = 0.0;
          pdVar8[3] = 0.0;
          *pdVar8 = 0.0;
          pdVar8[1] = 0.0;
          pdVar8 = pdVar8 + lVar15;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      uVar14 = local_d8;
      lVar15 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_rows;
      if (((long)local_d8 <= lVar15) &&
         ((long)local_d8 <=
          (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols + -6)) {
        pdVar8 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data + lVar15 * local_d8;
        if (((ulong)pdVar8 & 7) == 0) {
          local_c0 = (ulong)((uint)lVar15 & 1);
          uVar13 = (ulong)((uint)((ulong)pdVar8 >> 3) & 1);
          if ((long)local_d8 <= (long)uVar13) {
            uVar13 = local_d8;
          }
          local_b8 = lVar15 << 3;
          lVar15 = 6;
          do {
            if (0 < (long)uVar13) {
              *pdVar8 = 0.0;
            }
            uVar12 = uVar14 - uVar13;
            uVar9 = uVar12 & 0xfffffffffffffffe;
            lVar16 = uVar13 + uVar9;
            if (0 < (long)uVar9) {
              lVar7 = uVar13 + 2;
              if ((long)(uVar13 + 2) < lVar16) {
                lVar7 = lVar16;
              }
              memset(pdVar8 + uVar13,0,(~uVar13 + lVar7 & 0xfffffffffffffffe) * 8 + 0x10);
            }
            uVar14 = local_d8;
            if (lVar16 < (long)local_d8) {
              memset(pdVar8 + uVar9 + uVar13,0,(ulong)(((uint)uVar12 & 1) << 3));
            }
            uVar13 = (long)(uVar13 + local_c0) % 2;
            if ((long)uVar14 < (long)uVar13) {
              uVar13 = uVar14;
            }
            pdVar8 = (double *)((long)pdVar8 + local_b8);
            lVar15 = lVar15 + -1;
          } while (lVar15 != 0);
        }
        else {
          lVar16 = 6;
          do {
            memset(pdVar8,0,local_d0);
            pdVar8 = pdVar8 + lVar15;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
        }
        auVar4 = _DAT_0019a2a0;
        auVar3 = _DAT_00183010;
        lVar15 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        if (((long)uVar14 <= lVar15 + -6) &&
           ((long)uVar14 <=
            (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols + -6)) {
          dVar2 = this->absPosVariance_;
          lVar16 = (long)(this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                         .m_storage.m_data + uVar14 * lVar15 * 8 + local_d0;
          lVar7 = 0;
          do {
            iVar5 = (int)((ulong)lVar7 >> 0x20);
            lVar10 = 0;
            auVar17 = auVar3;
            do {
              auVar20._0_4_ = -(uint)(auVar17._0_4_ == (int)lVar7);
              lVar18 = auVar17._8_8_;
              auVar20._4_4_ = -(uint)(auVar17._4_4_ == iVar5);
              auVar20._8_4_ = -(uint)(auVar17._8_4_ == (int)lVar7);
              auVar20._12_4_ = -(uint)(auVar17._12_4_ == iVar5);
              auVar19._4_4_ = auVar20._0_4_;
              auVar19._0_4_ = auVar20._4_4_;
              auVar19._8_4_ = auVar20._12_4_;
              auVar19._12_4_ = auVar20._8_4_;
              auVar20 = auVar19 & auVar20 & auVar4;
              pdVar8 = (double *)(lVar16 + lVar10 * 8);
              *pdVar8 = auVar20._0_8_ * dVar2;
              pdVar8[1] = auVar20._8_8_ * dVar2;
              lVar10 = lVar10 + 2;
              auVar17._0_8_ = auVar17._0_8_ + 2;
              auVar17._8_8_ = lVar18 + 2;
            } while (lVar10 != 6);
            lVar7 = lVar7 + 1;
            lVar16 = lVar16 + lVar15 * 8;
            _this = local_c8;
          } while (lVar7 != 6);
          goto LAB_00151521;
        }
      }
    }
LAB_00151842:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                 );
  }
LAB_00151521:
  KalmanFilterBase::setR
            (&(this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase,_this);
  return;
}

Assistant:

void ModelBaseEKFFlexEstimatorIMU::updateMeasurementCovarianceMatrix_()
{

  if(R_.rows() != getMeasurementSize())
  {

    Index realIndex = R_.rows();
    R_.conservativeResize(getMeasurementSize(), getMeasurementSize());

    Index currIndex = 6;
    if(useFTSensors_)
    {
      /// if the force part of the matrix is not filled
      if(realIndex < currIndex + functor_.getContactsNumber() * 6)
      {
        R_.block(currIndex, 0, functor_.getContactsNumber() * 6, currIndex).setZero();
        R_.block(0, currIndex, currIndex, functor_.getContactsNumber() * 6).setZero();
        for(Index i = 0; i < functor_.getContactsNumber(); ++i)
        {
          R_.block(currIndex, currIndex, 6, 6) = forceVariance_;
          currIndex += 6;
        }
      }
    }

    if(withAbsolutePos_)
    {
      if(realIndex < currIndex + 6)
      {

        R_.block(currIndex, 0, 6, currIndex).setZero();
        R_.block(0, currIndex, currIndex, 6).setZero();
        R_.block(currIndex, currIndex, 6, 6) = Matrix::Identity(6, 6) * absPosVariance_;

        currIndex += 6;
      }
    }
  }
  ekf_.setR(R_);
}